

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsKeyReleased(int key_index)

{
  if (-1 < key_index) {
    if (0x1ff < (uint)key_index) {
      __assert_fail("key_index >= 0 && key_index < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown)))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0xc44,"bool ImGui::IsKeyReleased(int)");
    }
    if ((0.0 <= (GImGui->IO).KeysDownDurationPrev[(uint)key_index]) &&
       ((GImGui->IO).KeysDown[(uint)key_index] != true)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::IsKeyReleased(int key_index)
{
    ImGuiContext& g = *GImGui;
    if (key_index < 0) return false;
    IM_ASSERT(key_index >= 0 && key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    if (g.IO.KeysDownDurationPrev[key_index] >= 0.0f && !g.IO.KeysDown[key_index])
        return true;
    return false;
}